

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RamFileManager.cpp
# Opt level: O0

unique_ptr<supermap::io::OutputStream,_std::default_delete<supermap::io::OutputStream>_> __thiscall
supermap::io::RamFileManager::getOutputStream(RamFileManager *this,path *filename,bool append)

{
  bool bVar1;
  byte in_CL;
  allocator<char> *in_RSI;
  OutputStream *in_RDI;
  size_t fileIndex;
  const_iterator fileIt;
  value_type *in_stack_fffffffffffffeb8;
  File *in_stack_fffffffffffffec0;
  unique_ptr<supermap::io::StringOutputStream,_std::default_delete<supermap::io::StringOutputStream>_>
  *in_stack_fffffffffffffec8;
  unique_ptr<supermap::io::OutputStream,_std::default_delete<supermap::io::OutputStream>_>
  *in_stack_fffffffffffffed0;
  _Head_base<0UL,_supermap::io::OutputStream_*,_false> __args;
  char *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  path *in_stack_ffffffffffffff20;
  RamFileManager *in_stack_ffffffffffffff28;
  path *in_stack_ffffffffffffff50;
  RamFileManager *in_stack_ffffffffffffff58;
  unique_ptr<supermap::io::StringOutputStream,_std::default_delete<supermap::io::StringOutputStream>_>
  local_a0 [4];
  unique_ptr<supermap::io::OutputStream,_std::default_delete<supermap::io::OutputStream>_>
  local_80 [4];
  _Deque_iterator<supermap::io::RamFileManager::File,_supermap::io::RamFileManager::File_&,_supermap::io::RamFileManager::File_*>
  local_60;
  _Self local_40;
  byte local_19;
  
  local_19 = in_CL & 1;
  __args._M_head_impl = in_RDI;
  getFileIteratorNoThrow(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::
  deque<supermap::io::RamFileManager::File,_std::allocator<supermap::io::RamFileManager::File>_>::
  end((deque<supermap::io::RamFileManager::File,_std::allocator<supermap::io::RamFileManager::File>_>
       *)in_stack_fffffffffffffeb8);
  bVar1 = std::operator==(&local_40,&local_60);
  if (bVar1) {
    in_stack_fffffffffffffec0 = (File *)(in_RSI + 8);
    in_stack_fffffffffffffec8 = local_a0;
    std::filesystem::__cxx11::path::operator_cast_to_string((path *)in_stack_fffffffffffffeb8);
    in_stack_fffffffffffffed0 = local_80;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_RSI);
    std::
    deque<supermap::io::RamFileManager::File,_std::allocator<supermap::io::RamFileManager::File>_>::
    push_back((deque<supermap::io::RamFileManager::File,_std::allocator<supermap::io::RamFileManager::File>_>
               *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    File::~File(in_stack_fffffffffffffec0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff5f);
  }
  getFileIterator(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::
  deque<supermap::io::RamFileManager::File,_std::allocator<supermap::io::RamFileManager::File>_>::
  begin((deque<supermap::io::RamFileManager::File,_std::allocator<supermap::io::RamFileManager::File>_>
         *)in_stack_fffffffffffffeb8);
  std::operator-((_Self *)in_stack_fffffffffffffec0,
                 (_Deque_iterator<supermap::io::RamFileManager::File,_supermap::io::RamFileManager::File_&,_supermap::io::RamFileManager::File_*>
                  *)in_stack_fffffffffffffeb8);
  std::
  deque<supermap::io::RamFileManager::File,_std::allocator<supermap::io::RamFileManager::File>_>::
  operator[]((deque<supermap::io::RamFileManager::File,_std::allocator<supermap::io::RamFileManager::File>_>
              *)in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
  std::make_unique<supermap::io::StringOutputStream,std::__cxx11::string&,bool&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __args._M_head_impl,(bool *)in_RDI);
  std::unique_ptr<supermap::io::OutputStream,std::default_delete<supermap::io::OutputStream>>::
  unique_ptr<supermap::io::StringOutputStream,std::default_delete<supermap::io::StringOutputStream>,void>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  std::
  unique_ptr<supermap::io::StringOutputStream,_std::default_delete<supermap::io::StringOutputStream>_>
  ::~unique_ptr((unique_ptr<supermap::io::StringOutputStream,_std::default_delete<supermap::io::StringOutputStream>_>
                 *)in_stack_fffffffffffffec0);
  return (__uniq_ptr_data<supermap::io::OutputStream,_std::default_delete<supermap::io::OutputStream>,_true,_true>
          )(tuple<supermap::io::OutputStream_*,_std::default_delete<supermap::io::OutputStream>_>)
           __args._M_head_impl;
}

Assistant:

std::unique_ptr<OutputStream> RamFileManager::getOutputStream(const std::filesystem::path &filename, bool append) {
    auto fileIt = getFileIteratorNoThrow(filename);
    if (fileIt == files.end()) {
        files.push_back({filename, ""});
    }
    fileIt = getFileIterator(filename);
    std::size_t fileIndex = fileIt - files.begin();
    return std::make_unique<StringOutputStream>(files[fileIndex].content, append);
}